

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int aec_decode_init(aec_stream_conflict *strm)

{
  uint uVar1;
  uint32_t uVar2;
  int i;
  int iVar3;
  uint uVar4;
  internal_state_conflict *piVar5;
  code *pcVar6;
  _func_int_aec_stream_ptr_conflict **pp_Var7;
  ulong uVar8;
  uint32_t *puVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  
  uVar1 = strm->bits_per_sample;
  iVar13 = -1;
  if (0xffffffdf < uVar1 - 0x21) {
    iVar13 = 1;
    piVar5 = (internal_state_conflict *)calloc(1,0x350);
    if (piVar5 == (internal_state_conflict *)0x0) {
      iVar13 = -4;
    }
    else {
      iVar10 = 2;
      iVar12 = 1;
      iVar14 = 0;
      for (iVar3 = 0; iVar3 != 0xd; iVar3 = iVar3 + 1) {
        iVar15 = iVar13 + iVar14;
        for (lVar16 = (long)iVar14; iVar12 != lVar16; lVar16 = lVar16 + 1) {
          piVar5->se_table[lVar16 * 2] = iVar3;
          piVar5->se_table[lVar16 * 2 + 1] = iVar14;
        }
        iVar13 = iVar13 + 1;
        iVar12 = iVar12 + iVar10;
        iVar10 = iVar10 + 1;
        iVar14 = iVar15;
      }
      strm->state = piVar5;
      if (uVar1 < 0x11) {
        if (uVar1 < 9) {
          uVar18 = strm->flags;
          if ((uVar18 & 0x10) == 0) {
            piVar5->id_len = 3;
            iVar13 = 3;
          }
          else {
            if (4 < uVar1) {
              return -1;
            }
            if (uVar1 < 3) {
              piVar5->id_len = 1;
              iVar13 = 1;
            }
            else {
              piVar5->id_len = 2;
              iVar13 = 2;
            }
          }
          piVar5->bytes_per_sample = 1;
          uVar2 = strm->block_size;
          piVar5->out_blklen = uVar2;
          piVar5->flush_output = flush_8;
        }
        else {
          piVar5->bytes_per_sample = 2;
          piVar5->id_len = 4;
          uVar2 = strm->block_size;
          piVar5->out_blklen = uVar2 * 2;
          uVar18 = strm->flags;
          if ((uVar18 & 4) == 0) {
            pcVar6 = flush_lsb_16;
          }
          else {
            pcVar6 = flush_msb_16;
          }
          piVar5->flush_output = pcVar6;
          iVar13 = 4;
        }
      }
      else {
        piVar5->id_len = 5;
        uVar18 = strm->flags;
        if ((uVar18 & 2) == 0 || 0x18 < uVar1) {
          piVar5->bytes_per_sample = 4;
          pcVar6 = flush_msb_32;
          if ((uVar18 & 4) == 0) {
            pcVar6 = flush_lsb_32;
          }
          iVar13 = 4;
        }
        else {
          piVar5->bytes_per_sample = 3;
          pcVar6 = flush_msb_24;
          if ((uVar18 & 4) == 0) {
            pcVar6 = flush_lsb_24;
          }
          iVar13 = 3;
        }
        piVar5->flush_output = pcVar6;
        uVar2 = strm->block_size;
        piVar5->out_blklen = iVar13 * uVar2;
        iVar13 = 5;
      }
      if ((uVar18 & 1) == 0) {
        uVar4 = 0xffffffff >> (-(char)uVar1 & 0x1fU);
        uVar11 = 0;
      }
      else {
        uVar4 = 0xffffffff >> (0x21U - (char)uVar1 & 0x1f);
        uVar11 = ~uVar4;
      }
      piVar5->xmin = uVar11;
      piVar5->xmax = uVar4;
      piVar5->in_blklen = (uVar1 * uVar2 + iVar13 >> 3) + 0x10;
      pp_Var7 = (_func_int_aec_stream_ptr_conflict **)
                malloc((ulong)(0x100000000 << (sbyte)iVar13) >> 0x1d);
      piVar5->id_table = pp_Var7;
      if (pp_Var7 == (_func_int_aec_stream_ptr_conflict **)0x0) {
        iVar13 = -4;
      }
      else {
        *pp_Var7 = m_low_entropy;
        uVar17 = (ulong)((1 << (sbyte)iVar13) - 1);
        for (uVar8 = 1; uVar8 < uVar17; uVar8 = uVar8 + 1) {
          piVar5->id_table[uVar8] = m_split;
        }
        piVar5->id_table[uVar17] = m_uncomp;
        uVar8 = (ulong)(strm->rsi * uVar2);
        piVar5->rsi_size = uVar8;
        puVar9 = (uint32_t *)malloc(uVar8 << 2);
        piVar5->rsi_buffer = puVar9;
        iVar13 = -4;
        if (puVar9 != (uint32_t *)0x0) {
          uVar18 = uVar18 & 8;
          piVar5->pp = uVar18;
          piVar5->ref = uVar18 >> 3;
          piVar5->encoded_block_size = uVar2 + ((int)(uVar18 << 0x1c) >> 0x1f);
          strm->total_in = 0;
          strm->total_out = 0;
          piVar5->rsip = puVar9;
          piVar5->flush_start = puVar9;
          piVar5->bitp = 0;
          piVar5->fs = 0;
          piVar5->mode = m_id;
          iVar13 = 0;
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int aec_decode_init(struct aec_stream *strm)
{
    struct internal_state *state;

    if (strm->bits_per_sample > 32 || strm->bits_per_sample == 0)
        return AEC_CONF_ERROR;

    state = malloc(sizeof(struct internal_state));
    if (state == NULL)
        return AEC_MEM_ERROR;
    memset(state, 0, sizeof(struct internal_state));

    create_se_table(state->se_table);

    strm->state = state;

    if (strm->bits_per_sample > 16) {
        state->id_len = 5;

        if (strm->bits_per_sample <= 24 && strm->flags & AEC_DATA_3BYTE) {
            state->bytes_per_sample = 3;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_24;
            else
                state->flush_output = flush_lsb_24;
        } else {
            state->bytes_per_sample = 4;
            if (strm->flags & AEC_DATA_MSB)
                state->flush_output = flush_msb_32;
            else
                state->flush_output = flush_lsb_32;
        }
        state->out_blklen = strm->block_size * state->bytes_per_sample;
    }
    else if (strm->bits_per_sample > 8) {
        state->bytes_per_sample = 2;
        state->id_len = 4;
        state->out_blklen = strm->block_size * 2;
        if (strm->flags & AEC_DATA_MSB)
            state->flush_output = flush_msb_16;
        else
            state->flush_output = flush_lsb_16;
    } else {
        if (strm->flags & AEC_RESTRICTED) {
            if (strm->bits_per_sample <= 4) {
                if (strm->bits_per_sample <= 2)
                    state->id_len = 1;
                else
                    state->id_len = 2;
            } else {
                return AEC_CONF_ERROR;
            }
        } else {
            state->id_len = 3;
        }

        state->bytes_per_sample = 1;
        state->out_blklen = strm->block_size;
        state->flush_output = flush_8;
    }

    if (strm->flags & AEC_DATA_SIGNED) {
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample + 1);
        state->xmin = ~state->xmax;
    } else {
        state->xmin = 0;
        state->xmax = UINT32_MAX >> (32 - strm->bits_per_sample);
    }

    state->in_blklen = (strm->block_size * strm->bits_per_sample
                        + state->id_len) / 8 + 16;

    int modi = 1UL << state->id_len;
    state->id_table = malloc(modi * sizeof(int (*)(struct aec_stream *)));
    if (state->id_table == NULL)
        return AEC_MEM_ERROR;

    state->id_table[0] = m_low_entropy;
    for (int i = 1; i < modi - 1; i++) {
        state->id_table[i] = m_split;
    }
    state->id_table[modi - 1] = m_uncomp;

    state->rsi_size = strm->rsi * strm->block_size;
    state->rsi_buffer = malloc(state->rsi_size * sizeof(uint32_t));
    if (state->rsi_buffer == NULL)
        return AEC_MEM_ERROR;

    state->pp = strm->flags & AEC_DATA_PREPROCESS;
    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }
    strm->total_in = 0;
    strm->total_out = 0;

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;
    return AEC_OK;
}